

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdm.cpp
# Opt level: O0

void __thiscall FDMEulerExplicit::step_march(FDMEulerExplicit *this)

{
  reference pvVar1;
  ostream *poVar2;
  int local_220;
  int j;
  ostream local_210 [8];
  ofstream fdm_out;
  FDMEulerExplicit *this_local;
  
  std::ofstream::ofstream(local_210,"fdm.csv",0x10);
  while ((this->super_FDMBase).cur_t < (this->super_FDMBase).t_dom) {
    (this->super_FDMBase).cur_t = (this->super_FDMBase).prev_t + (this->super_FDMBase).dt;
    (*(this->super_FDMBase)._vptr_FDMBase[2])();
    (*(this->super_FDMBase)._vptr_FDMBase[3])();
    for (local_220 = 0; (ulong)(long)local_220 < (this->super_FDMBase).J; local_220 = local_220 + 1)
    {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_FDMBase).x_values,(long)local_220);
      poVar2 = (ostream *)std::ostream::operator<<(local_210,*pvVar1);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_FDMBase).prev_t);
      poVar2 = std::operator<<(poVar2," ");
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->super_FDMBase).new_result,(long)local_220);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar1);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_FDMBase).old_result,&(this->super_FDMBase).new_result);
    (this->super_FDMBase).prev_t = (this->super_FDMBase).cur_t;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FDMEulerExplicit::step_march()
{
    std::ofstream fdm_out("fdm.csv");

    while(cur_t < t_dom)
    {
        cur_t = prev_t + dt;
        calculate_boundary_conditions();
        calculate_inner_domain();
        for (int j=0; j<J; j++)
        {
            fdm_out << x_values[j] << " " << prev_t << " " << new_result[j] << std::endl;
        }

        old_result = new_result;
        prev_t = cur_t;
    }
    fdm_out.close();
}